

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

ON_Mesh * __thiscall ON_Mesh::DuplicateFace(ON_Mesh *this,int face_index,ON_Mesh *mesh)

{
  bool bVar1;
  int iVar2;
  uint mesh_vertex_count;
  uint uVar3;
  ON_MeshFace *pOVar4;
  ON_3fVector *pOVar5;
  ON_2fPoint *x;
  ON_Color *x_00;
  ON_2dPoint *x_01;
  ON_SurfaceCurvature *x_02;
  int local_bc;
  ON_3fPoint *local_b0;
  ON_3dPoint *local_a0;
  int local_84;
  int vi;
  ON_MeshFace *newface;
  ON_3dPointArray *newdV;
  undefined1 auStack_58 [4];
  int newvcnt;
  ON_MeshFace f;
  bool bHasPrincipalCurvatures;
  bool bHasSurfaceParameters;
  bool bHasTextureCoordinates;
  bool bHasVertexColors;
  bool bHasVertexNormals;
  bool bHasFaceNormals;
  ON_3fPoint *fV;
  ON_3dPoint *dV;
  ON_Mesh *pOStack_28;
  uint vcnt;
  ON_Mesh *mesh_local;
  int face_index_local;
  ON_Mesh *this_local;
  
  if (mesh == this) {
    this_local = (ON_Mesh *)0x0;
  }
  else {
    if (mesh != (ON_Mesh *)0x0) {
      Destroy(mesh);
    }
    if ((face_index < 0) ||
       (iVar2 = ON_SimpleArray<ON_MeshFace>::Count(&this->m_F), iVar2 <= face_index)) {
      this_local = (ON_Mesh *)0x0;
    }
    else {
      mesh_vertex_count = VertexUnsignedCount(this);
      if (mesh_vertex_count < 3) {
        this_local = (ON_Mesh *)0x0;
      }
      else {
        uVar3 = ON_SimpleArray<ON_3dPoint>::UnsignedCount
                          (&(this->m_dV).super_ON_SimpleArray<ON_3dPoint>);
        if (mesh_vertex_count == uVar3) {
          local_a0 = ON_SimpleArray<ON_3dPoint>::Array
                               (&(this->m_dV).super_ON_SimpleArray<ON_3dPoint>);
        }
        else {
          local_a0 = (ON_3dPoint *)0x0;
        }
        if ((local_a0 == (ON_3dPoint *)0x0) &&
           (uVar3 = ON_SimpleArray<ON_3fPoint>::UnsignedCount
                              (&(this->m_V).super_ON_SimpleArray<ON_3fPoint>),
           mesh_vertex_count == uVar3)) {
          local_b0 = ON_SimpleArray<ON_3fPoint>::Array
                               (&(this->m_V).super_ON_SimpleArray<ON_3fPoint>);
        }
        else {
          local_b0 = (ON_3fPoint *)0x0;
        }
        f.vi[3]._3_1_ = HasFaceNormals(this);
        f.vi[3]._2_1_ = HasVertexNormals(this);
        f.vi[3]._1_1_ = HasVertexColors(this);
        f.vi[3]._0_1_ = HasTextureCoordinates(this);
        f.vi[2]._3_1_ = HasSurfaceParameters(this);
        f.vi[2]._2_1_ = HasPrincipalCurvatures(this);
        pOVar4 = ON_SimpleArray<ON_MeshFace>::operator[](&this->m_F,face_index);
        _auStack_58 = *(undefined8 *)pOVar4->vi;
        f.vi._0_8_ = *(undefined8 *)(pOVar4->vi + 2);
        if (local_a0 == (ON_3dPoint *)0x0) {
          if (local_b0 == (ON_3fPoint *)0x0) {
            return (ON_Mesh *)0x0;
          }
          bVar1 = ON_MeshFace::IsValid((ON_MeshFace *)auStack_58,mesh_vertex_count,local_b0);
          if ((!bVar1) &&
             (bVar1 = ON_MeshFace::Repair((ON_MeshFace *)auStack_58,mesh_vertex_count,local_b0),
             !bVar1)) {
            return (ON_Mesh *)0x0;
          }
        }
        else {
          bVar1 = ON_MeshFace::IsValid((ON_MeshFace *)auStack_58,mesh_vertex_count,local_a0);
          if ((!bVar1) &&
             (bVar1 = ON_MeshFace::Repair((ON_MeshFace *)auStack_58,mesh_vertex_count,local_a0),
             !bVar1)) {
            return (ON_Mesh *)0x0;
          }
        }
        bVar1 = ON_MeshFace::IsTriangle((ON_MeshFace *)auStack_58);
        iVar2 = 4;
        if (bVar1) {
          iVar2 = 3;
        }
        pOStack_28 = mesh;
        if (mesh == (ON_Mesh *)0x0) {
          pOStack_28 = (ON_Mesh *)operator_new(0x6e0);
          ON_Mesh(pOStack_28);
        }
        newface = (ON_MeshFace *)0x0;
        if (local_a0 != (ON_3dPoint *)0x0) {
          newface = (ON_MeshFace *)&pOStack_28->m_dV;
          ON_SimpleArray<ON_3dPoint>::Reserve((ON_SimpleArray<ON_3dPoint> *)newface,(long)iVar2);
        }
        ON_SimpleArray<ON_3fPoint>::Reserve
                  (&(pOStack_28->m_V).super_ON_SimpleArray<ON_3fPoint>,(long)iVar2);
        ON_SimpleArray<ON_MeshFace>::Reserve(&pOStack_28->m_F,1);
        pOVar4 = ON_SimpleArray<ON_MeshFace>::AppendNew(&pOStack_28->m_F);
        pOVar4->vi[0] = 0;
        pOVar4->vi[1] = 1;
        pOVar4->vi[2] = 2;
        if (iVar2 == 4) {
          local_bc = 3;
        }
        else {
          local_bc = pOVar4->vi[2];
        }
        pOVar4->vi[3] = local_bc;
        if ((f.vi[3]._3_1_ & 1) != 0) {
          ON_SimpleArray<ON_3fVector>::Reserve
                    (&(pOStack_28->m_FN).super_ON_SimpleArray<ON_3fVector>,1);
          pOVar5 = ON_SimpleArray<ON_3fVector>::operator[]
                             (&(this->m_FN).super_ON_SimpleArray<ON_3fVector>,face_index);
          ON_SimpleArray<ON_3fVector>::Append
                    (&(pOStack_28->m_FN).super_ON_SimpleArray<ON_3fVector>,pOVar5);
        }
        if ((f.vi[3]._2_1_ & 1) != 0) {
          ON_SimpleArray<ON_3fVector>::Reserve
                    (&(pOStack_28->m_N).super_ON_SimpleArray<ON_3fVector>,(long)iVar2);
        }
        if (((byte)f.vi[3] & 1) != 0) {
          ON_SimpleArray<ON_2fPoint>::Reserve
                    (&(pOStack_28->m_T).super_ON_SimpleArray<ON_2fPoint>,(long)iVar2);
        }
        if ((f.vi[3]._1_1_ & 1) != 0) {
          ON_SimpleArray<ON_Color>::Reserve(&pOStack_28->m_C,(long)iVar2);
        }
        if ((f.vi[2]._3_1_ & 1) != 0) {
          ON_SimpleArray<ON_2dPoint>::Reserve
                    (&(pOStack_28->m_S).super_ON_SimpleArray<ON_2dPoint>,(long)iVar2);
        }
        if ((f.vi[2]._2_1_ & 1) != 0) {
          ON_SimpleArray<ON_SurfaceCurvature>::Reserve(&pOStack_28->m_K,(long)iVar2);
        }
        for (local_84 = 0; local_84 < iVar2; local_84 = local_84 + 1) {
          if (local_a0 == (ON_3dPoint *)0x0) {
            ON_SimpleArray<ON_3fPoint>::Append
                      (&(pOStack_28->m_V).super_ON_SimpleArray<ON_3fPoint>,
                       local_b0 + *(int *)(auStack_58 + (long)local_84 * 4));
          }
          else {
            ON_SimpleArray<ON_3dPoint>::Append
                      ((ON_SimpleArray<ON_3dPoint> *)newface,
                       local_a0 + *(int *)(auStack_58 + (long)local_84 * 4));
          }
          if ((f.vi[3]._2_1_ & 1) != 0) {
            pOVar5 = ON_SimpleArray<ON_3fVector>::operator[]
                               (&(this->m_N).super_ON_SimpleArray<ON_3fVector>,
                                *(int *)(auStack_58 + (long)local_84 * 4));
            ON_SimpleArray<ON_3fVector>::Append
                      (&(pOStack_28->m_N).super_ON_SimpleArray<ON_3fVector>,pOVar5);
          }
          if (((byte)f.vi[3] & 1) != 0) {
            x = ON_SimpleArray<ON_2fPoint>::operator[]
                          (&(this->m_T).super_ON_SimpleArray<ON_2fPoint>,
                           *(int *)(auStack_58 + (long)local_84 * 4));
            ON_SimpleArray<ON_2fPoint>::Append
                      (&(pOStack_28->m_T).super_ON_SimpleArray<ON_2fPoint>,x);
          }
          if ((f.vi[3]._1_1_ & 1) != 0) {
            x_00 = ON_SimpleArray<ON_Color>::operator[]
                             (&this->m_C,*(int *)(auStack_58 + (long)local_84 * 4));
            ON_SimpleArray<ON_Color>::Append(&pOStack_28->m_C,x_00);
          }
          if ((f.vi[2]._3_1_ & 1) != 0) {
            x_01 = ON_SimpleArray<ON_2dPoint>::operator[]
                             (&(this->m_S).super_ON_SimpleArray<ON_2dPoint>,
                              *(int *)(auStack_58 + (long)local_84 * 4));
            ON_SimpleArray<ON_2dPoint>::Append
                      (&(pOStack_28->m_S).super_ON_SimpleArray<ON_2dPoint>,x_01);
          }
          if ((f.vi[2]._2_1_ & 1) != 0) {
            x_02 = ON_SimpleArray<ON_SurfaceCurvature>::operator[]
                             (&this->m_K,*(int *)(auStack_58 + (long)local_84 * 4));
            ON_SimpleArray<ON_SurfaceCurvature>::Append(&pOStack_28->m_K,x_02);
          }
        }
        if (local_a0 != (ON_3dPoint *)0x0) {
          UpdateSinglePrecisionVertices(pOStack_28);
        }
        this_local = pOStack_28;
      }
    }
  }
  return this_local;
}

Assistant:

ON_Mesh* ON_Mesh::DuplicateFace( int face_index, ON_Mesh* mesh ) const
{
  if ( mesh == this )
    return nullptr;
  if ( 0 != mesh )
    mesh->Destroy();
  if ( face_index < 0 || face_index >= m_F.Count() )
    return nullptr;
  const unsigned int vcnt = VertexUnsignedCount();
  if ( vcnt < 3 )
    return nullptr;

  const ON_3dPoint* dV = ( vcnt == m_dV.UnsignedCount() ) ? m_dV.Array() : nullptr;
  const ON_3fPoint* fV = (nullptr == dV && vcnt == m_V.UnsignedCount() ) ? m_V.Array() : nullptr;
  bool bHasFaceNormals = HasFaceNormals();
  bool bHasVertexNormals = HasVertexNormals();
  bool bHasVertexColors = HasVertexColors();
  bool bHasTextureCoordinates = HasTextureCoordinates();
  bool bHasSurfaceParameters = HasSurfaceParameters();
  bool bHasPrincipalCurvatures = HasPrincipalCurvatures();

  ON_MeshFace f = m_F[face_index];
  if ( nullptr != dV )
  {
    if ( !f.IsValid(vcnt,dV) )
    {
      // invalid vertex indices - see if it can be fixed
      if ( !f.Repair(vcnt,dV) )
        return nullptr;
    }
  }
  else if (nullptr != fV)
  {
    if (!f.IsValid(vcnt, fV))
    {
      // invalid vertex indices - see if it can be fixed
      if (!f.Repair(vcnt, fV))
        return nullptr;
    }
  }
  else
    return nullptr;

  const int newvcnt = f.IsTriangle() ? 3 : 4;
  if ( 0 == mesh )
    mesh = new ON_Mesh();
  ON_3dPointArray* newdV = 0;
  if ( dV )
  {
    newdV = &mesh->m_dV;
    newdV->Reserve(newvcnt);
  }
  mesh->m_V.Reserve(newvcnt);
  mesh->m_F.Reserve(1);
  ON_MeshFace& newface = mesh->m_F.AppendNew();
  newface.vi[0] = 0;
  newface.vi[1] = 1;
  newface.vi[2] = 2;
  newface.vi[3] = (4 == newvcnt) ? 3 : newface.vi[2];

  if ( bHasFaceNormals )
  {
    mesh->m_FN.Reserve(1);
    mesh->m_FN.Append(m_FN[face_index]);
  }

  if ( bHasVertexNormals )
    mesh->m_N.Reserve(newvcnt);
  if ( bHasTextureCoordinates )
    mesh->m_T.Reserve(newvcnt);
  if ( bHasVertexColors )
    mesh->m_C.Reserve(newvcnt);
  if ( bHasSurfaceParameters )
    mesh->m_S.Reserve(newvcnt);
  if ( bHasPrincipalCurvatures )
    mesh->m_K.Reserve(newvcnt);
  for ( int vi = 0; vi < newvcnt; vi++ )
  {
    if ( dV )
      newdV->Append(dV[f.vi[vi]]);
    else
      mesh->m_V.Append(fV[f.vi[vi]]);
    if ( bHasVertexNormals )
      mesh->m_N.Append(m_N[f.vi[vi]]);
    if ( bHasTextureCoordinates )
      mesh->m_T.Append(m_T[f.vi[vi]]);
    if ( bHasVertexColors )
      mesh->m_C.Append(m_C[f.vi[vi]]);
    if ( bHasSurfaceParameters )
      mesh->m_S.Append(m_S[f.vi[vi]]);
    if ( bHasPrincipalCurvatures )
      mesh->m_K.Append(m_K[f.vi[vi]]);
  }
  if ( nullptr != dV )
    mesh->UpdateSinglePrecisionVertices();

  return mesh;
}